

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O1

int PAL_fseek(PAL_FILE *pf,LONG lOffset,int nWhence)

{
  int iVar1;
  FILE *__stream;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (pf == (PAL_FILE *)0x0) {
      __stream = (FILE *)0x0;
    }
    else {
      __stream = (FILE *)pf->bsdFilePtr;
    }
    iVar1 = fseek(__stream,(long)lOffset,nWhence);
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

int
_cdecl
PAL_fseek(
    PAL_FILE * pf,
    LONG lOffset,
    int nWhence
    )
{
    int nRet = 0;

    PERF_ENTRY(fseek);
    ENTRY( "fseek( %p, %ld, %d )\n", pf, lOffset, nWhence );

    nRet = fseek(pf ? pf->bsdFilePtr : NULL, lOffset, nWhence);

    LOGEXIT("fseek returning %d\n", nRet);
    PERF_EXIT(fseek);
    return nRet;
}